

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_object.cpp
# Opt level: O3

uint32_t mjs::anon_unknown_110::check_array_length(global_object *g,double n)

{
  uint32_t uVar1;
  native_error_exception *this;
  wstring local_58;
  wstring_view local_38;
  wstring_view local_28;
  
  uVar1 = to_uint32(n);
  if (0 < (int)g->version_) {
    if (((double)uVar1 != n) || (NAN((double)uVar1) || NAN(n))) {
      this = (native_error_exception *)__cxa_allocate_exception(0x58);
      global_object::stack_trace_abi_cxx11_(&local_58,g);
      local_28._M_len = local_58._M_string_length;
      local_28._M_str = local_58._M_dataplus._M_p;
      local_38._M_len = 0x14;
      local_38._M_str = L"Invalid array length";
      native_error_exception::native_error_exception(this,range,&local_28,&local_38);
      __cxa_throw(this,&native_error_exception::typeinfo,
                  native_error_exception::~native_error_exception);
    }
  }
  return uVar1;
}

Assistant:

uint32_t check_array_length(const global_object& g, const double n) {
    const auto l = to_uint32(n);
    if (g.language_version() >= version::es3 && n != l) {
        throw native_error_exception(native_error_type::range, g.stack_trace(), L"Invalid array length");
    }
    return l;
}